

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O0

double __thiscall
singular::Svd<60,_50>::BidiagonalMatrix::applyRotatorFromRight
          (BidiagonalMatrix *this,Rotator *r,int n,double bulge)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double r22;
  double r21;
  double r12;
  double r11;
  double b2;
  double g1;
  double b1;
  double g0;
  double *p;
  double bulge_local;
  int n_local;
  Rotator *r_local;
  BidiagonalMatrix *this_local;
  
  pdVar5 = this->pBlock + (n << 1);
  dVar1 = pdVar5[-1];
  dVar2 = *pdVar5;
  dVar3 = pdVar5[1];
  dVar4 = pdVar5[2];
  dVar6 = Rotator::operator()(r,0,0);
  dVar7 = Rotator::operator()(r,0,1);
  dVar8 = Rotator::operator()(r,1,0);
  dVar9 = Rotator::operator()(r,1,1);
  pdVar5[-1] = dVar1 * dVar6 + bulge * dVar8;
  *pdVar5 = dVar2 * dVar6 + dVar3 * dVar8;
  pdVar5[1] = dVar2 * dVar7 + dVar3 * dVar9;
  pdVar5[2] = dVar4 * dVar9;
  return dVar4 * dVar8;
}

Assistant:

double applyRotatorFromRight(
				const Rotator& r, int n, double bulge)
			{
				double* p = this->pBlock + n * 2;
				double g0 = p[-1];
				double b1 = p[0];
				double g1 = p[1];
				double b2 = p[2];
				double r11 = r(0, 0);
				double r12 = r(0, 1);
				double r21 = r(1, 0);
				double r22 = r(1, 1);
				p[-1] = g0 * r11 + bulge * r21;
				p[0] = b1 * r11 + g1 * r21;
				p[1] = b1 * r12 + g1 * r22;
				p[2] = b2 * r22;
				return b2 * r21;
			}